

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O1

void __thiscall
slang::SourceSnippet::SourceSnippet(SourceSnippet *this,string_view sourceLine,uint32_t tabStop)

{
  byte *b;
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  uint32_t j;
  uint uVar8;
  byte *last;
  size_type sVar9;
  size_t sVar10;
  size_type __n;
  ulong __n_00;
  SourceSnippet *pSVar11;
  ulong uVar12;
  uint32_t c;
  int error;
  char buf [4];
  int unused;
  SmallVector<char,_40UL> buffer;
  uint32_t local_10c;
  SourceSnippet *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  int local_f4;
  size_t local_f0;
  reverse_iterator<char_*> local_e8;
  undefined1 local_e0 [24];
  char local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  uint32_t local_b8;
  int local_b4;
  SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *local_b0;
  char *local_a8;
  SmallVectorBase<char> local_a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  char *local_50;
  char *local_48;
  size_type local_40;
  reverse_iterator<char_*> local_38;
  
  local_a8 = sourceLine._M_str;
  sVar10 = sourceLine._M_len;
  local_48 = (this->byteToColumn).super_SmallVectorBase<int>.firstElement;
  (this->byteToColumn).super_SmallVectorBase<int>.data_ = (pointer)local_48;
  (this->byteToColumn).super_SmallVectorBase<int>.len = 0;
  (this->byteToColumn).super_SmallVectorBase<int>.cap = 10;
  local_b0 = (SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *)&this->invalidRanges;
  local_50 = (this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.
             firstElement;
  (this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.data_ =
       (pointer)local_50;
  (this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.len = 0;
  (this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.cap = 4;
  local_c0 = &this->snippetLine;
  local_58 = &(this->snippetLine).field_2;
  (this->snippetLine)._M_dataplus._M_p = (pointer)local_58;
  (this->snippetLine)._M_string_length = 0;
  (this->snippetLine).field_2._M_local_buf[0] = '\0';
  local_60 = &(this->highlightLine).field_2;
  (this->highlightLine)._M_dataplus._M_p = (pointer)local_60;
  (this->highlightLine)._M_string_length = 0;
  (this->highlightLine).field_2._M_local_buf[0] = '\0';
  local_b8 = tabStop;
  SmallVectorBase<int>::resizeImpl<slang::SmallVectorBase<int>::ValueInitTag>
            ((SmallVectorBase<int> *)this,sVar10 + 1,(ValueInitTag *)local_a0);
  sVar9 = (this->byteToColumn).super_SmallVectorBase<int>.len;
  local_f0 = sVar10;
  if (sVar9 != 0) {
    memset((this->byteToColumn).super_SmallVectorBase<int>.data_,0xff,sVar9 << 2);
  }
  sVar10 = local_f0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (local_c0,local_f0);
  local_a0[0].data_ = local_a0[0].firstElement;
  local_a0[0].len = 0;
  local_a0[0].cap = 0x28;
  __n = 0;
  local_100 = &this->highlightLine;
  if (sVar10 != 0) {
    uVar12 = 0;
    local_108 = this;
    do {
      (local_108->byteToColumn).super_SmallVectorBase<int>.data_[uVar12] = (int)__n;
      local_a0[0].len = 0;
      local_40 = __n;
      if (local_a8[uVar12] == '\t') {
        uVar8 = 0;
        uVar3 = 0;
        if (uVar12 != 0) {
          uVar3 = 0;
          uVar6 = uVar12;
          do {
            if (local_a8[uVar6 - 1] == '\t') goto LAB_001c0d72;
            uVar6 = uVar6 - 1;
            uVar3 = uVar3 + 1;
          } while (uVar6 != 0);
          uVar3 = (uint)uVar12;
        }
LAB_001c0d72:
        uVar3 = local_b8 - uVar3 % local_b8;
        do {
          local_e0[0] = 0x20;
          SmallVectorBase<char>::emplace_back<char>(local_a0,(char *)local_e0);
          uVar8 = uVar8 + 1;
        } while (uVar8 < uVar3);
        bVar2 = true;
LAB_001c0e8f:
        uVar12 = uVar12 + 1;
        sVar9 = local_a0[0].len;
        pSVar11 = local_108;
      }
      else {
        b = (byte *)(local_a8 + uVar12);
        if (local_f0 < uVar12 + 4) {
          local_e0._0_8_ = local_e0._0_8_ & 0xffffffff00000000;
          __n_00 = local_f0 - uVar12;
          memcpy((SmallVectorBase<char> *)local_e0,b,__n_00);
          pcVar5 = utf8Decode((char *)local_e0,&local_10c,&local_f4,&local_b4);
          uVar6 = (long)pcVar5 - (long)local_e0;
          if (__n_00 < uVar6) {
            uVar6 = __n_00;
          }
          last = b + uVar6;
        }
        else {
          last = (byte *)utf8Decode((char *)b,&local_10c,&local_f4,&local_b4);
        }
        if (local_f4 != 0) {
          bVar1 = *b;
          sVar9 = local_a0[0].len + 4;
          SmallVectorBase<char>::reserve(local_a0,sVar9);
          lVar7 = 0;
          do {
            local_a0[0].data_[lVar7 + local_a0[0].len] = "<XX>"[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          local_a0[0].data_[1] = "0123456789ABCDEF"[bVar1 >> 4];
          local_a0[0].data_[2] = "0123456789ABCDEF"[bVar1 & 0xf];
          bVar2 = false;
          local_a0[0].len = sVar9;
          goto LAB_001c0e8f;
        }
        bVar2 = isPrintableUnicode(local_10c);
        uVar12 = (long)last - (long)local_a8;
        if (bVar2) {
          SmallVectorBase<char>::append<const_char_*>(local_a0,(char *)b,(char *)last);
          iVar4 = charWidthUnicode(local_10c);
          sVar9 = (size_type)iVar4;
          bVar2 = true;
          pSVar11 = local_108;
        }
        else {
          local_e0._0_8_ = local_c8;
          local_e0._8_8_ = 0;
          local_e0._16_8_ = 8;
          do {
            local_e8.current._0_1_ = "0123456789ABCDEF"[local_10c & 0xf];
            SmallVectorBase<char>::emplace_back<char>
                      ((SmallVectorBase<char> *)local_e0,(char *)&local_e8);
            uVar3 = local_10c >> 4;
            bVar2 = 0xf < local_10c;
            local_10c = uVar3;
          } while (bVar2);
          sVar9 = local_a0[0].len + 3;
          SmallVectorBase<char>::reserve(local_a0,sVar9);
          pSVar11 = local_108;
          lVar7 = 0;
          do {
            local_a0[0].data_[lVar7 + local_a0[0].len] = "<U+"[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          local_e8.current = (char *)(local_e0._0_8_ + local_e0._8_8_);
          local_38.current = (char *)local_e0._0_8_;
          local_a0[0].len = sVar9;
          SmallVectorBase<char>::append<std::reverse_iterator<char_*>_>
                    (local_a0,&local_e8,&local_38);
          local_e8.current._0_1_ = 0x3e;
          SmallVectorBase<char>::emplace_back<char>(local_a0,(char *)&local_e8);
          sVar9 = local_a0[0].len;
          if ((char *)local_e0._0_8_ != local_c8) {
            operator_delete((void *)local_e0._0_8_);
          }
          bVar2 = false;
        }
      }
      if (!bVar2) {
        local_e0._0_8_ = (pSVar11->snippetLine)._M_string_length;
        local_e0._8_8_ = local_a0[0].len;
        SmallVectorBase<std::pair<unsigned_long,unsigned_long>>::
        emplace_back<std::pair<unsigned_long,unsigned_long>>
                  (local_b0,(pair<unsigned_long,_unsigned_long> *)local_e0);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (local_c0,local_a0[0].data_,local_a0[0].len);
      __n = local_40 + sVar9;
      this = local_108;
    } while (uVar12 < local_f0);
  }
  (this->byteToColumn).super_SmallVectorBase<int>.data_[local_f0] = (int)__n;
  local_e0._0_8_ = local_e0 + 0x10;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,__n,' ');
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_100,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
            );
  if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
    operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
  }
  if (local_a0[0].data_ != local_a0[0].firstElement) {
    operator_delete(local_a0[0].data_);
  }
  return;
}

Assistant:

SourceSnippet(std::string_view sourceLine, uint32_t tabStop) {
        SLANG_ASSERT(!sourceLine.empty());

        byteToColumn.resize(sourceLine.size() + 1);
        for (size_t i = 0; i < byteToColumn.size(); i++)
            byteToColumn[i] = -1;

        snippetLine.reserve(sourceLine.size());

        SmallVector<char> buffer;
        size_t column = 0;
        size_t i = 0;
        while (i < sourceLine.size()) {
            byteToColumn[i] = (int)column;

            size_t columnWidth;
            buffer.clear();
            if (!printableTextForNextChar(sourceLine, i, tabStop, buffer, columnWidth))
                invalidRanges.push_back({snippetLine.size(), buffer.size()});

            snippetLine.append(buffer.data(), buffer.size());
            column += columnWidth;
        }

        byteToColumn[sourceLine.size()] = (int)column;
        highlightLine = std::string(column, ' ');
    }